

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  byte bVar2;
  Descriptor *pDVar3;
  Message *pMVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  MessageLite *pMVar8;
  OneofDescriptor *pOVar9;
  undefined8 *puVar10;
  char *description;
  Metadata MVar11;
  
  MVar11 = Message::GetMetadata(message);
  if (MVar11.reflection != this) goto LAB_0025b131;
  pDVar3 = this->descriptor_;
  if (field->containing_type_ != pDVar3) {
    description = "Field does not match message type.";
LAB_0025b16f:
    anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"ReleaseMessage",description);
  }
  bVar2 = field->field_0x1;
  if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) {
    if ((bVar2 & 0x20) != 0) {
      description = "Field is repeated; the method requires a singular field.";
      goto LAB_0025b16f;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
      anon_unknown_6::ReportReflectionUsageTypeError(pDVar3,field,"ReleaseMessage",CPPTYPE_MESSAGE);
    }
    if ((bVar2 & 8) != 0) {
      if (factory == (MessageFactory *)0x0) {
        factory = this->message_factory_;
      }
      uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      pMVar8 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),
                          field,factory);
      return (Message *)pMVar8;
    }
    if (0xbf < bVar2) goto LAB_0025b109;
    this_00 = &this->schema_;
    bVar5 = internal::ReflectionSchema::InRealOneof(this_00,field);
    if (bVar5) goto LAB_0025b002;
    if ((field->options_->field_0)._impl_.weak_ == true) goto LAB_0025b113;
    uVar6 = internal::ReflectionSchema::HasBitIndex(this_00,field);
    if (uVar6 != 0xffffffff) {
      if ((this->schema_).has_bits_offset_ == -1) goto LAB_0025b11d;
      bVar2 = (byte)uVar6 & 0x1f;
      uVar7 = internal::ReflectionSchema::HasBitsOffset(this_00);
      puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar6 >> 5) * 4 + (ulong)uVar7);
      *puVar1 = *puVar1 & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    }
LAB_0025b002:
    bVar5 = internal::ReflectionSchema::InRealOneof(this_00,field);
    if (!bVar5) {
LAB_0025b0bf:
      VerifyFieldType<google::protobuf::Message*>(this,field);
      puVar10 = (undefined8 *)MutableRawImpl(this,message,field);
      pMVar4 = (Message *)*puVar10;
      *puVar10 = 0;
      return pMVar4;
    }
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar9 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar9 = (field->scope_).containing_oneof;
      if (pOVar9 == (OneofDescriptor *)0x0) goto LAB_0025b18b;
    }
    uVar6 = GetOneofCase(this,message,pOVar9);
    if (uVar6 != field->number_) {
      return (Message *)0x0;
    }
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar9 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar9 = (field->scope_).containing_oneof;
      if (pOVar9 == (OneofDescriptor *)0x0) {
LAB_0025b18b:
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    if ((pOVar9->field_count_ != 1) || ((pOVar9->fields_->field_0x1 & 2) == 0)) {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)((long)pOVar9 - (long)pOVar9->containing_type_->oneof_decls_) >> 3
                          ) * -0x24924924 + (this->schema_).oneof_case_offset_)) = 0;
      goto LAB_0025b0bf;
    }
  }
  else {
    UnsafeArenaReleaseMessage();
LAB_0025b109:
    UnsafeArenaReleaseMessage();
LAB_0025b113:
    UnsafeArenaReleaseMessage();
LAB_0025b11d:
    UnsafeArenaReleaseMessage();
  }
  UnsafeArenaReleaseMessage();
LAB_0025b131:
  pDVar3 = this->descriptor_;
  MVar11 = Message::GetMetadata(message);
  anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,MVar11.descriptor,field,"ReleaseMessage")
  ;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearHasBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}